

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O3

idx_t duckdb::IEJoinUnion::AppendKey
                (SortedTable *table,ExpressionExecutor *executor,SortedTable *marked,
                int64_t increment,int64_t base,idx_t block_idx)

{
  GlobalSortState *global_sort_state;
  __int_type _Var1;
  __int_type _Var2;
  idx_t count;
  Allocator *pAVar3;
  pointer pRVar4;
  long lVar5;
  reference this;
  idx_t iVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  vector<duckdb::LogicalType,_true> types;
  DataChunk payload;
  DataChunk scanned;
  DataChunk keys;
  LocalSortState local_sort_state;
  PayloadScanner local_208;
  vector<duckdb::LogicalType,_true> local_1f0;
  idx_t local_1d8;
  idx_t local_1d0;
  ExpressionExecutor *local_1c8;
  DataChunk local_1c0;
  DataChunk local_180;
  DataChunk local_140;
  LocalSortState local_100;
  
  local_1c8 = executor;
  LocalSortState::LocalSortState(&local_100);
  global_sort_state = &marked->global_sort_state;
  LocalSortState::Initialize
            (&local_100,global_sort_state,(marked->global_sort_state).buffer_manager);
  _Var1 = (table->count).super___atomic_base<unsigned_long>._M_i;
  _Var2 = (table->has_null).super___atomic_base<unsigned_long>._M_i;
  PayloadScanner::PayloadScanner(&local_208,&table->global_sort_state,block_idx,false);
  uVar9 = block_idx * (table->global_sort_state).block_capacity;
  DataChunk::DataChunk(&local_180);
  pAVar3 = Allocator::DefaultAllocator();
  pRVar4 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
           ::operator->(&local_208.scanner);
  DataChunk::Initialize(&local_180,pAVar3,&(pRVar4->layout).types,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1f0,
             &((local_100.sort_layout)->logical_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  lVar5 = (long)local_1f0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_1f0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType_const*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_1f0,
             local_1f0.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish,
             ((local_100.payload_layout)->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start,
             ((local_100.payload_layout)->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish);
  DataChunk::DataChunk(&local_140);
  DataChunk::DataChunk(&local_1c0);
  pAVar3 = Allocator::DefaultAllocator();
  DataChunk::Initialize(&local_140,pAVar3,&local_1f0,0x800);
  uVar7 = _Var1 - _Var2;
  if (uVar9 < uVar7) {
    local_1d8 = (lVar5 >> 3) * -0x5555555555555555;
    local_1d0 = ((long)local_1f0.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1f0.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1;
    iVar8 = 0;
    do {
      DataChunk::Reset(&local_180);
      PayloadScanner::Scan(&local_208,&local_180);
      if (uVar7 < uVar9 + local_180.count) {
        local_180.count = uVar7 - uVar9;
      }
      count = local_180.count;
      if (local_180.count == 0) break;
      DataChunk::Reset(&local_140);
      DataChunk::Split(&local_140,&local_1c0,local_1d0);
      ExpressionExecutor::Execute(local_1c8,&local_180,&local_140);
      this = vector<duckdb::Vector,_true>::operator[](&local_1c0.data,0);
      Vector::Sequence(this,base,increment,count);
      local_1c0.count = count;
      DataChunk::Fuse(&local_140,&local_1c0);
      DataChunk::Split(&local_140,&local_1c0,local_1d8);
      LocalSortState::SinkChunk(&local_100,&local_140,&local_1c0);
      DataChunk::Fuse(&local_140,&local_1c0);
      iVar6 = LocalSortState::SizeInBytes(&local_100);
      if (marked->memory_per_thread <= iVar6) {
        LocalSortState::Sort(&local_100,global_sort_state,true);
      }
      uVar9 = uVar9 + count;
      base = base + count * increment;
      iVar8 = iVar8 + count;
    } while (uVar9 < uVar7);
  }
  else {
    iVar8 = 0;
  }
  GlobalSortState::AddLocalState(global_sort_state,&local_100);
  LOCK();
  (marked->count).super___atomic_base<unsigned_long>._M_i =
       (marked->count).super___atomic_base<unsigned_long>._M_i + iVar8;
  UNLOCK();
  DataChunk::~DataChunk(&local_1c0);
  DataChunk::~DataChunk(&local_140);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1f0);
  DataChunk::~DataChunk(&local_180);
  if ((__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
       )local_208.scanner.
        super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
       )0x0) {
    RowDataCollectionScanner::~RowDataCollectionScanner
              ((RowDataCollectionScanner *)
               local_208.scanner.
               super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
               .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl);
    operator_delete((void *)local_208.scanner.
                            super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>.
                            _M_head_impl);
  }
  local_208.scanner.
  super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
  .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        )(__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
          )0x0;
  if (local_208.heap.
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
       )0x0) {
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
               ((long)local_208.heap.
                      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl + 0x38
               ));
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               *)((long)local_208.heap.
                        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                 0x20));
    operator_delete((void *)local_208.heap.
                            super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl)
    ;
  }
  local_208.heap.
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>)
       (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
        )0x0;
  if (local_208.rows.
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
       )0x0) {
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
               ((long)local_208.rows.
                      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl + 0x38
               ));
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               *)((long)local_208.rows.
                        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                 0x20));
    operator_delete((void *)local_208.rows.
                            super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                            .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl)
    ;
  }
  LocalSortState::~LocalSortState(&local_100);
  return iVar8;
}

Assistant:

idx_t IEJoinUnion::AppendKey(SortedTable &table, ExpressionExecutor &executor, SortedTable &marked, int64_t increment,
                             int64_t base, const idx_t block_idx) {
	LocalSortState local_sort_state;
	local_sort_state.Initialize(marked.global_sort_state, marked.global_sort_state.buffer_manager);

	// Reading
	const auto valid = table.count - table.has_null;
	auto &gstate = table.global_sort_state;
	PayloadScanner scanner(gstate, block_idx);
	auto table_idx = block_idx * gstate.block_capacity;

	DataChunk scanned;
	scanned.Initialize(Allocator::DefaultAllocator(), scanner.GetPayloadTypes());

	// Writing
	auto types = local_sort_state.sort_layout->logical_types;
	const idx_t payload_idx = types.size();

	const auto &payload_types = local_sort_state.payload_layout->GetTypes();
	types.insert(types.end(), payload_types.begin(), payload_types.end());
	const idx_t rid_idx = types.size() - 1;

	DataChunk keys;
	DataChunk payload;
	keys.Initialize(Allocator::DefaultAllocator(), types);

	idx_t inserted = 0;
	for (auto rid = base; table_idx < valid;) {
		scanned.Reset();
		scanner.Scan(scanned);

		// NULLs are at the end, so stop when we reach them
		auto scan_count = scanned.size();
		if (table_idx + scan_count > valid) {
			scan_count = valid - table_idx;
			scanned.SetCardinality(scan_count);
		}
		if (scan_count == 0) {
			break;
		}
		table_idx += scan_count;

		// Compute the input columns from the payload
		keys.Reset();
		keys.Split(payload, rid_idx);
		executor.Execute(scanned, keys);

		// Mark the rid column
		payload.data[0].Sequence(rid, increment, scan_count);
		payload.SetCardinality(scan_count);
		keys.Fuse(payload);
		rid += increment * UnsafeNumericCast<int64_t>(scan_count);

		// Sort on the sort columns (which will no longer be needed)
		keys.Split(payload, payload_idx);
		local_sort_state.SinkChunk(keys, payload);
		inserted += scan_count;
		keys.Fuse(payload);

		// Flush when we have enough data
		if (local_sort_state.SizeInBytes() >= marked.memory_per_thread) {
			local_sort_state.Sort(marked.global_sort_state, true);
		}
	}
	marked.global_sort_state.AddLocalState(local_sort_state);
	marked.count += inserted;

	return inserted;
}